

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O3

void __thiscall
Js::JavascriptPromiseThunkFinallyFunction::JavascriptPromiseThunkFinallyFunction
          (JavascriptPromiseThunkFinallyFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          Var value,bool shouldThrow)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014d36a8;
  Memory::Recycler::WBSetBit((char *)&this->value);
  (this->value).ptr = value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->value);
  this->shouldThrow = shouldThrow;
  return;
}

Assistant:

JavascriptPromiseThunkFinallyFunction(DynamicType* type, FunctionInfo* functionInfo, Var value, bool shouldThrow)
            : RuntimeFunction(type, functionInfo), value(value), shouldThrow(shouldThrow)
        { }